

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  uint32_t *puVar1;
  LRUHandle *pLVar2;
  bool bVar3;
  int iVar4;
  LRUHandle **ppLVar5;
  undefined8 uVar6;
  long lVar7;
  LRUCache *this_00;
  Mutex *__mutex;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = 0;
  do {
    __mutex = &this->shard_[lVar7].mutex_;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar6 = std::__throw_system_error(iVar4);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          _Unwind_Resume(uVar6);
        }
      }
      goto LAB_0068515f;
    }
    this_00 = this->shard_ + lVar7;
    while (pLVar2 = (this_00->lru_).next, pLVar2 != &this_00->lru_) {
      if (pLVar2->refs != 1) {
        __assert_fail("e->refs == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x147,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
      if (pLVar2->next == pLVar2) {
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      local_48.data_ = pLVar2->key_data;
      local_48.size_ = pLVar2->key_length;
      ppLVar5 = HandleTable::FindPointer(&this_00->table_,&local_48,pLVar2->hash);
      pLVar2 = *ppLVar5;
      if (pLVar2 != (LRUHandle *)0x0) {
        *ppLVar5 = pLVar2->next_hash;
        puVar1 = &(this_00->table_).elems_;
        *puVar1 = *puVar1 - 1;
      }
      bVar3 = LRUCache::FinishErase(this_00,pLVar2);
      if (!bVar3) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x14a,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0068515f:
  __stack_chk_fail();
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }